

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

IndirOpnd * __thiscall
Lowerer::GetArgsIndirOpndForTopFunction(Lowerer *this,Instr *ldElem,Opnd *valueOpnd)

{
  code *pcVar1;
  bool bVar2;
  byte scale;
  uint16 uVar3;
  ushort uVar4;
  JITTimeFunctionBody *pJVar5;
  undefined4 *puVar6;
  IntConstOpnd *pIVar7;
  long lVar8;
  RegOpnd *baseOpnd_00;
  RegOpnd *indexOpnd;
  RegOpnd *local_58;
  BYTE indirScale;
  IntConstType offset;
  IndirOpnd *pIStack_30;
  uint16 actualOffset;
  IndirOpnd *argIndirOpnd;
  RegOpnd *baseOpnd;
  Opnd *valueOpnd_local;
  Instr *ldElem_local;
  Lowerer *this_local;
  
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsCoroutine(pJVar5);
  if (bVar2) {
    local_58 = LoadGeneratorArgsPtr(ldElem);
  }
  else {
    local_58 = IR::Opnd::CreateFramePointerOpnd(this->m_func);
  }
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsCoroutine(pJVar5);
  if (bVar2) {
    uVar4 = 1;
  }
  else {
    uVar3 = GetFormalParamOffset();
    uVar4 = uVar3 + 1;
  }
  if (uVar4 != 5) {
    pJVar5 = Func::GetJITFunctionBody(this->m_func);
    bVar2 = JITTimeFunctionBody::IsGenerator(pJVar5);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x5666,
                         "(actualOffset == 5 || m_func->GetJITFunctionBody()->IsGenerator())",
                         "actualOffset == 5 || m_func->GetJITFunctionBody()->IsGenerator()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  bVar2 = IR::Opnd::IsIntConstOpnd(valueOpnd);
  if (bVar2) {
    pIVar7 = IR::Opnd::AsIntConstOpnd(valueOpnd);
    lVar8 = IR::EncodableOpnd<long>::GetValue(&pIVar7->super_EncodableOpnd<long>);
    pIStack_30 = IR::IndirOpnd::New(local_58,((int)lVar8 + (uint)uVar4) * 8,TyInt64,this->m_func,
                                    false);
  }
  else {
    scale = LowererMD::GetDefaultIndirScale();
    baseOpnd_00 = IR::Opnd::AsRegOpnd(&local_58->super_Opnd);
    indexOpnd = IR::Opnd::AsRegOpnd(valueOpnd);
    pIStack_30 = IR::IndirOpnd::New(baseOpnd_00,indexOpnd,scale,TyInt64,this->m_func);
    IR::IndirOpnd::SetOffset(pIStack_30,(uint)uVar4 << (scale & 0x1f),false);
  }
  return pIStack_30;
}

Assistant:

IR::IndirOpnd*
Lowerer::GetArgsIndirOpndForTopFunction(IR::Instr* ldElem, IR::Opnd* valueOpnd)
{
    // Load argument set dst = [ebp + index] (or grab from the generator object if m_func is a generator function).
    IR::RegOpnd *baseOpnd = m_func->GetJITFunctionBody()->IsCoroutine() ? LoadGeneratorArgsPtr(ldElem) : IR::Opnd::CreateFramePointerOpnd(m_func);
    IR::IndirOpnd* argIndirOpnd = nullptr;
    // The stack looks like this:
    //       ...
    //       arguments[1]
    //       arguments[0]
    //       this
    //       callinfo
    //       function object
    //       return addr
    // EBP-> EBP chain

    //actual arguments offset is LowererMD::GetFormalParamOffset() + 1 (this)

    uint16 actualOffset = m_func->GetJITFunctionBody()->IsCoroutine() ? 1 : GetFormalParamOffset() + 1; //5
    Assert(actualOffset == 5 || m_func->GetJITFunctionBody()->IsGenerator());
    if (valueOpnd->IsIntConstOpnd())
    {
        IntConstType offset = (valueOpnd->AsIntConstOpnd()->GetValue() + actualOffset) * MachPtr;
        // TODO: Assert(Math::FitsInDWord(offset));
        argIndirOpnd = IR::IndirOpnd::New(baseOpnd, (int32)offset, TyMachReg, this->m_func);
    }
    else
    {
        const BYTE indirScale = this->m_lowererMD.GetDefaultIndirScale();
        argIndirOpnd = IR::IndirOpnd::New(baseOpnd->AsRegOpnd(), valueOpnd->AsRegOpnd(), indirScale, TyMachReg, this->m_func);

        // Need to offset valueOpnd by 5. Instead of changing valueOpnd, we can just add an offset to the indir. Changing
        // valueOpnd requires creation of a temp sym (if it's not already a temp) so that the value of the sym that
        // valueOpnd represents is not changed.
        argIndirOpnd->SetOffset(actualOffset << indirScale);
    }
    return argIndirOpnd;
}